

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>
::PropagateResult(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>
                  *this,BasicFlatConverter *cvt,int i,double lb,double ub,Context ctx)

{
  CtxVal CVar1;
  _Elt_pointer pCVar2;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  *pCVar3;
  Error *this_00;
  ulong uVar4;
  
  pCVar2 = (this->cons_).
           super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar4 = ((long)pCVar2 -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) * 0x2e8ba2e8ba2e8ba3 +
          (long)i;
  if (uVar4 < 2) {
    pCVar2 = pCVar2 + i;
  }
  else {
    pCVar2 = (this->cons_).
             super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>::Container>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar4 >> 1] +
             uVar4 + (uVar4 >> 1) * -2;
  }
  CVar1 = (pCVar2->ctx_redef_).value_;
  if ((CVar1 != CTX_NONE) &&
     (CVar1 != ctx.value_ && (ctx.value_ != CTX_NONE && (CVar1 != CTX_MIX || ctx.value_ == CTX_MIX))
     )) {
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_00,(CStringRef)0x380b72,-1);
    __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  pCVar3 = GetConstraint(this,i);
  Context::Add(&(pCVar3->super_FunctionalConstraint).ctx,ctx);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)cvt,(pCVar3->
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                    args_._M_elems[0],-INFINITY,INFINITY,(Context)0x4);
  return;
}

Assistant:

void PropagateResult(BasicFlatConverter& cvt,
                       int i,
                       double lb, double ub, Context ctx) override {
    try {
      // Too strong: instead, differentiate context
      // in which the redefinition happened #248.
      // MP_ASSERT_ALWAYS(ctx.IsSubsetOf(GetContext())
      //                  || IsBridgingToBeConsidered(i),
      auto ctx_redef = cons_[i].GetRedefContext();
      MP_ASSERT_ALWAYS(ctx_redef.IsNone()
                           || ctx.IsSubsetOf(ctx_redef),
                       "Part of expression redefinition\n"
                       "could be lost. Please contact\n"
                       "AMPL customer support.");
      static_cast<Converter&>(cvt).PropagateResult(
            GetConstraint(i), lb, ub, ctx);
    } catch (const std::exception& exc) {
      MP_RAISE(Converter::GetTypeName() +
               std::string(": propagating result for constraint ") +
               std::to_string(i) + "\nof type '" +
               Constraint::GetTypeName() +
               "':\n" + exc.what());
    }
  }